

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O3

ZeroCopyInputStream * __thiscall
google::protobuf::compiler::DiskSourceTree::OpenVirtualFile
          (DiskSourceTree *this,string *virtual_file,string *disk_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_t __n;
  _Alloc_hider _Var3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ZeroCopyInputStream *pZVar7;
  int *piVar8;
  char *pcVar9;
  pointer pMVar10;
  char *pcVar11;
  DiskSourceTree *this_00;
  long lVar12;
  ulong uVar13;
  string temp_disk_file;
  string local_b0;
  ZeroCopyInputStream *local_90;
  string *local_88;
  string *local_80;
  DiskSourceTree *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  paVar1 = &local_70.field_2;
  pcVar2 = (virtual_file->_M_dataplus)._M_p;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar2,pcVar2 + virtual_file->_M_string_length);
  CanonicalizePath(&local_b0,&local_70);
  _Var3._M_p = local_b0._M_dataplus._M_p;
  __n = virtual_file->_M_string_length;
  if ((__n == local_b0._M_string_length) &&
     ((__n == 0 ||
      (iVar6 = bcmp((virtual_file->_M_dataplus)._M_p,local_b0._M_dataplus._M_p,__n), iVar6 == 0))))
  {
    local_78 = (DiskSourceTree *)virtual_file;
    bVar4 = ContainsParentReference(virtual_file);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (!bVar4) {
      pMVar10 = (this->mappings_).
                super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_80 = disk_file;
      if ((this->mappings_).
          super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar10) {
        local_88 = (string *)&this->last_error_message_;
        lVar12 = 0x20;
        uVar13 = 0;
        do {
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          local_b0._M_string_length = 0;
          local_b0.field_2._M_local_buf[0] = '\0';
          this_00 = local_78;
          bVar5 = ApplyMapping((string *)local_78,(string *)((long)pMVar10 + lVar12 + -0x20),
                               (string *)((long)&(pMVar10->virtual_path)._M_dataplus._M_p + lVar12),
                               &local_b0);
          bVar4 = true;
          if (bVar5) {
            pZVar7 = OpenDiskFile(this_00,&local_b0);
            if (pZVar7 == (ZeroCopyInputStream *)0x0) {
              piVar8 = __errno_location();
              if (*piVar8 == 0xd) {
                std::operator+(&local_50,"Read access is denied for file: ",&local_b0);
                std::__cxx11::string::operator=(local_88,(string *)&local_50);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                bVar4 = false;
                local_90 = (ZeroCopyInputStream *)0x0;
              }
            }
            else {
              if (local_80 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)local_80);
              }
              bVar4 = false;
              local_90 = pZVar7;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
            operator_delete(local_b0._M_dataplus._M_p,
                            CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                                     local_b0.field_2._M_local_buf[0]) + 1);
          }
          if (!bVar4) {
            return local_90;
          }
          uVar13 = uVar13 + 1;
          pMVar10 = (this->mappings_).
                    super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar12 = lVar12 + 0x40;
        } while (uVar13 < (ulong)((long)(this->mappings_).
                                        super__Vector_base<google::protobuf::compiler::DiskSourceTree::Mapping,_std::allocator<google::protobuf::compiler::DiskSourceTree::Mapping>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar10
                                 >> 6));
      }
      pcVar11 = (char *)(this->last_error_message_)._M_string_length;
      pcVar9 = "File not found.";
      goto LAB_002c9d11;
    }
  }
  else {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var3._M_p != &local_b0.field_2) {
      operator_delete(_Var3._M_p,
                      CONCAT71(local_b0.field_2._M_allocated_capacity._1_7_,
                               local_b0.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != paVar1) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  pcVar11 = (char *)(this->last_error_message_)._M_string_length;
  pcVar9 = "Backslashes, consecutive slashes, \".\", or \"..\" are not allowed in the virtual path";
LAB_002c9d11:
  std::__cxx11::string::_M_replace((ulong)&this->last_error_message_,0,pcVar11,(ulong)pcVar9);
  return (ZeroCopyInputStream *)0x0;
}

Assistant:

io::ZeroCopyInputStream* DiskSourceTree::OpenVirtualFile(
    const string& virtual_file,
    string* disk_file) {
  if (virtual_file != CanonicalizePath(virtual_file) ||
      ContainsParentReference(virtual_file)) {
    // We do not allow importing of paths containing things like ".." or
    // consecutive slashes since the compiler expects files to be uniquely
    // identified by file name.
    last_error_message_ = "Backslashes, consecutive slashes, \".\", or \"..\" "
                          "are not allowed in the virtual path";
    return NULL;
  }

  for (int i = 0; i < mappings_.size(); i++) {
    string temp_disk_file;
    if (ApplyMapping(virtual_file, mappings_[i].virtual_path,
                     mappings_[i].disk_path, &temp_disk_file)) {
      io::ZeroCopyInputStream* stream = OpenDiskFile(temp_disk_file);
      if (stream != NULL) {
        if (disk_file != NULL) {
          *disk_file = temp_disk_file;
        }
        return stream;
      }

      if (errno == EACCES) {
        // The file exists but is not readable.
        last_error_message_ = "Read access is denied for file: " +
                              temp_disk_file;
        return NULL;
      }
    }
  }
  last_error_message_ = "File not found.";
  return NULL;
}